

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O1

void do_door_bash(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  EXIT_DATA *pEVar2;
  CHAR_DATA *ch_00;
  bool bVar3;
  int iVar4;
  uint door;
  int iVar5;
  CClass *this;
  char *pcVar6;
  long lVar7;
  AFFECT_DATA af;
  char arg [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    pcVar6 = "Bash door which door?\n\r";
    goto LAB_00258f18;
  }
  iVar4 = get_skill(ch,(int)gsn_door_bash);
  bVar3 = is_npc(ch);
  iVar5 = 0x32;
  if (!bVar3) {
    iVar5 = iVar4;
  }
  bVar3 = is_npc(ch);
  if (bVar3) {
LAB_00258efe:
    if (ch->move < 5) {
      pcVar6 = "You are too exhausted.\n\r";
    }
    else {
      pcVar6 = arg;
      door = find_door(ch,pcVar6);
      if ((int)door < 0) {
        return;
      }
      pEVar2 = ch->in_room->exit[door];
      if ((pEVar2->exit_info[0] & 2U) == 0) {
        pcVar6 = "It\'s not closed.\n\r";
      }
      else {
        if ((pEVar2->exit_info[0] & 0x404U) != 0) {
          bVar3 = is_npc(ch);
          if (!bVar3) {
            iVar4 = iVar5 + 3;
            if (-1 < iVar5) {
              iVar4 = iVar5;
            }
            sVar1 = ch->carry_weight;
            pcVar6 = (char *)0x0;
            iVar5 = get_curr_stat(ch,0);
            iVar5 = iVar5 / 2 + (int)sVar1 / 10 + (iVar4 >> 2);
          }
          bVar3 = is_npc(ch);
          if (!bVar3) {
            pcVar6 = "planar";
            bVar3 = str_cmp(pc_race_table[ch->race].name,"planar");
            if (bVar3) {
              pcVar6 = "abyss";
              bVar3 = str_cmp(pc_race_table[ch->race].name,"abyss");
              if (bVar3) {
                pcVar6 = "celestial";
                bVar3 = str_cmp(pc_race_table[ch->race].name,"celestial");
                if (bVar3) goto LAB_00259079;
              }
            }
            iVar5 = iVar5 + 0x14;
          }
LAB_00259079:
          bVar3 = is_npc(ch);
          if ((!bVar3) && (bVar3 = is_immortal(ch), bVar3)) {
            iVar5 = 100;
          }
          do_visible(ch,pcVar6);
          iVar4 = number_percent();
          if ((iVar5 < iVar4) || ((pEVar2->exit_info[0] & 0x80) != 0)) {
            pcVar6 = dir_name[door];
            act("$n flies into the $T door and rebounds with a great lack of dignity!",ch,
                (void *)0x0,pcVar6,0);
            act("You fly into the door $T but simply bounce off it like a lump of rock!",ch,
                (void *)0x0,pcVar6,3);
            ch_00 = ((pEVar2->u1).to_room)->people;
            if (ch_00 != (CHAR_DATA *)0x0) {
              act("The door buckles as a heavy weight crashes against it from the other side!",ch_00
                  ,(void *)0x0,(void *)0x0,4);
            }
            iVar5 = dice((int)ch->level,2);
            damage_new(ch,ch,iVar5,(int)gsn_door_bash,1,true,false,0,1,"the impact*");
            check_improve(ch,(int)gsn_door_bash,false,1);
            ch->position = 5;
            WAIT_STATE(ch,0x24);
            return;
          }
          pcVar6 = dir_name[door];
          act("$n slams into the $T door and throws it open with a mighty crash!",ch,(void *)0x0,
              pcVar6,0);
          act("You slam into the $T door and it cracks open with a deafening sound!",ch,(void *)0x0,
              pcVar6,3);
          check_improve(ch,(int)gsn_door_bash,true,1);
          WAIT_STATE(ch,0x18);
          *(ushort *)pEVar2->exit_info = (ushort)pEVar2->exit_info[0] & 0xfbf9;
          if ((((pEVar2->u1).to_room != (ROOM_INDEX_DATA *)0x0) &&
              (pEVar2 = ((pEVar2->u1).to_room)->exit[rev_dir[door]], pEVar2 != (EXIT_DATA *)0x0)) &&
             ((pEVar2->u1).to_room == ch->in_room)) {
            *(ushort *)pEVar2->exit_info = (ushort)pEVar2->exit_info[0] & 0xfbf9;
          }
          iVar5 = number_percent();
          iVar4 = get_curr_stat(ch,3);
          if (SBORROW4(iVar5,iVar4 * 3) != iVar5 + iVar4 * -3 < 0) {
            return;
          }
          bVar3 = is_npc(ch);
          if (bVar3) {
            return;
          }
          init_affect(&af);
          af.where = 0;
          af.aftype = 1;
          af.type = gsn_door_bash;
          af.modifier = 0;
          af.duration = -1;
          af.location = 0;
          af.level = ch->level;
          affect_to_char(ch,&af);
          move_char(ch,door,false,true);
          switchD_002e4026::default(ch,(int)gsn_door_bash);
          return;
        }
        pcVar6 = "It\'s already unlocked, why not just use the knob?\n\r";
      }
    }
  }
  else {
    if (iVar5 != 0) {
      sVar1 = ch->level;
      lVar7 = (long)gsn_door_bash;
      this = ch->my_class;
      if ((this == (CClass *)0x0) &&
         ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
          (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
        this = CClass::GetClass(0);
      }
      iVar4 = CClass::GetIndex(this);
      if (*(short *)(lVar7 * 0x60 + 0x45a788 + (long)iVar4 * 2) <= sVar1) goto LAB_00258efe;
    }
    pcVar6 = "You\'d hurt yourself doing that.\n\r";
  }
LAB_00258f18:
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void do_door_bash(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Bash door which door?\n\r", ch);
		return;
	}

	auto chance = get_skill(ch, gsn_door_bash);

	if (is_npc(ch))
		chance = 50;

	if (!is_npc(ch) && (chance == 0 || ch->level < skill_table[gsn_door_bash].skill_level[ch->Class()->GetIndex()]))
	{
		send_to_char("You'd hurt yourself doing that.\n\r", ch);
		return;
	}

	if (ch->move < 5)
	{
		send_to_char("You are too exhausted.\n\r", ch);
		return;
	}

	auto door = find_door(ch, arg);
	if (door < 0)
		return;

	auto pexit = ch->in_room->exit[door];
	if (!IS_SET(pexit->exit_info, EX_CLOSED))
	{
		send_to_char("It's not closed.\n\r", ch);
		return;
	}

	if (!IS_SET(pexit->exit_info, EX_LOCKED) && !IS_SET(pexit->exit_info, EX_JAMMED))
	{
		send_to_char("It's already unlocked, why not just use the knob?\n\r", ch);
		return;
	}

	if (!is_npc(ch))
	{
		chance /= 4;
		chance += ch->carry_weight / 10;
		chance += get_curr_stat(ch, STAT_STR) / 2;
	}

	if (!is_npc(ch))
	{
		if (!str_cmp(pc_race_table[ch->race].name, "planar")
			|| !str_cmp(pc_race_table[ch->race].name, "abyss")
			|| !str_cmp(pc_race_table[ch->race].name, "celestial"))
		{
			chance += 20;
		}
	}

	if (!is_npc(ch) && is_immortal(ch))
		chance = 100;

	do_visible(ch, "");

	if (number_percent() > chance || IS_SET(pexit->exit_info, EX_NOBASH))
	{
		act("$n flies into the $T door and rebounds with a great lack of dignity!", ch, 0, dir_name[door], TO_ROOM);
		act("You fly into the door $T but simply bounce off it like a lump of rock!", ch, 0, dir_name[door], TO_CHAR);

		if (pexit->u1.to_room->people)
			act("The door buckles as a heavy weight crashes against it from the other side!", pexit->u1.to_room->people, 0, 0, TO_ALL);

		damage_new(ch, ch, dice(ch->level, 2), gsn_door_bash, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the impact*");

		check_improve(ch, gsn_door_bash, false, 1);

		ch->position = POS_RESTING;

		WAIT_STATE(ch, 3 * PULSE_VIOLENCE);
		return;
	}

	act("$n slams into the $T door and throws it open with a mighty crash!", ch, 0, dir_name[door], TO_ROOM);
	act("You slam into the $T door and it cracks open with a deafening sound!", ch, 0, dir_name[door], TO_CHAR);

	check_improve(ch, gsn_door_bash, true, 1);

	WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
	REMOVE_BIT(pexit->exit_info, EX_LOCKED);
	REMOVE_BIT(pexit->exit_info, EX_CLOSED);
	REMOVE_BIT(pexit->exit_info, EX_JAMMED);

	auto to_room = pexit->u1.to_room;
	auto pexit_rev = to_room->exit[rev_dir[door]];

	if (to_room != nullptr && pexit_rev != nullptr && pexit_rev->u1.to_room == ch->in_room)
	{
		REMOVE_BIT(pexit_rev->exit_info, EX_LOCKED);
		REMOVE_BIT(pexit_rev->exit_info, EX_CLOSED);
		REMOVE_BIT(pexit_rev->exit_info, EX_JAMMED);
	}

	if (number_percent() < (3 * get_curr_stat(ch, STAT_DEX)) || is_npc(ch))
		return;

	/*
	* Affect to char so in move_char you relay the right move message, then
	*  strip affect once moved.
	*/
	AFFECT_DATA af;
	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SKILL;
	af.type = gsn_door_bash;
	af.location = 0;
	af.modifier = 0;
	af.duration = -1;
	af.level = ch->level;
	affect_to_char(ch, &af);

	move_char(ch, door, false, true);
	affect_strip(ch, gsn_door_bash);
}